

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_2::BinaryAtomicIntermValuesInstance::commandsAfterCompute
          (BinaryAtomicIntermValuesInstance *this,VkCommandBuffer cmdBuffer)

{
  image *this_00;
  deUint32 *this_01;
  deUint64 dVar1;
  VkImageSubresourceRange subresourceRange_00;
  deUint32 dVar2;
  uint uVar3;
  uint y_;
  uint z_;
  deUint32 dVar4;
  DeviceInterface *pDVar5;
  Image *pIVar6;
  VkImage *pVVar7;
  Buffer *this_02;
  VkBuffer *pVVar8;
  UVec3 *imageSize;
  VkExtent3D VVar9;
  image *local_118;
  uint local_110;
  undefined1 local_f8 [8];
  VkBufferImageCopy bufferImageCopyParams;
  UVec3 extendedLayerSize;
  UVec3 layerSize;
  undefined1 local_80 [8];
  VkImageMemoryBarrier imagePostDispatchBarrier;
  undefined4 uStack_30;
  VkImageSubresourceRange subresourceRange;
  DeviceInterface *deviceInterface;
  VkCommandBuffer cmdBuffer_local;
  BinaryAtomicIntermValuesInstance *this_local;
  
  pDVar5 = Context::getDeviceInterface
                     ((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context);
  imageSize = &(this->super_BinaryAtomicInstanceBase).m_imageSize;
  dVar2 = getNumLayers((this->super_BinaryAtomicInstanceBase).m_imageType,imageSize);
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)&imagePostDispatchBarrier.field_0x44,1,0,1,0,dVar2);
  pIVar6 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
           operator->(&(this->m_intermResultsImage).
                       super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>);
  pVVar7 = image::Image::get(pIVar6);
  subresourceRange_00.levelCount = subresourceRange.aspectMask;
  subresourceRange_00.aspectMask = imagePostDispatchBarrier._68_4_;
  subresourceRange_00.baseMipLevel = uStack_30;
  subresourceRange_00.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_00.layerCount = subresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_80,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,(VkImage)pVVar7->m_internal,subresourceRange_00);
  dVar2 = 0;
  (*pDVar5->_vptr_DeviceInterface[0x6d])
            (pDVar5,cmdBuffer,0x800,0x1000,0,0,0,0,0,1,(VkImageMemoryBarrier *)local_80);
  this_00 = (image *)(extendedLayerSize.m_data + 1);
  getLayerSize(this_00,(this->super_BinaryAtomicInstanceBase).m_imageType,imageSize);
  uVar3 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)this_00);
  y_ = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)this_00);
  z_ = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)this_00);
  this_01 = &bufferImageCopyParams.imageExtent.height;
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this_01,uVar3 * 5,y_,z_);
  VVar9 = ::vk::makeExtent3D((UVec3 *)this_01);
  local_118 = VVar9._0_8_;
  local_110 = VVar9.depth;
  dVar4 = getNumLayers((this->super_BinaryAtomicInstanceBase).m_imageType,
                       &(this->super_BinaryAtomicInstanceBase).m_imageSize);
  VVar9.height = 0;
  VVar9.width = local_110;
  VVar9.depth = dVar4;
  makeBufferImageCopy((VkBufferImageCopy *)local_f8,local_118,VVar9,dVar2);
  pIVar6 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
           operator->(&(this->m_intermResultsImage).
                       super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>);
  pVVar7 = image::Image::get(pIVar6);
  dVar1 = pVVar7->m_internal;
  this_02 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
            operator->(&(this->super_BinaryAtomicInstanceBase).m_outputBuffer.
                        super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                      );
  pVVar8 = image::Buffer::get(this_02);
  (*pDVar5->_vptr_DeviceInterface[99])(pDVar5,cmdBuffer,dVar1,6,pVVar8->m_internal,1,local_f8);
  return;
}

Assistant:

void BinaryAtomicIntermValuesInstance::commandsAfterCompute (const VkCommandBuffer cmdBuffer) const
{
	const DeviceInterface&			deviceInterface		= m_context.getDeviceInterface();
	const VkImageSubresourceRange	subresourceRange	= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));

	const VkImageMemoryBarrier	imagePostDispatchBarrier =
		makeImageMemoryBarrier(	VK_ACCESS_SHADER_WRITE_BIT,
								VK_ACCESS_TRANSFER_READ_BIT,
								VK_IMAGE_LAYOUT_GENERAL,
								VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
								m_intermResultsImage->get(),
								subresourceRange);

	deviceInterface.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, DE_FALSE, 0u, DE_NULL, 0u, DE_NULL, 1u, &imagePostDispatchBarrier);

	const UVec3					layerSize				= getLayerSize(m_imageType, m_imageSize);
	const UVec3					extendedLayerSize		= UVec3(NUM_INVOCATIONS_PER_PIXEL * layerSize.x(), layerSize.y(), layerSize.z());
	const VkBufferImageCopy		bufferImageCopyParams	= makeBufferImageCopy(makeExtent3D(extendedLayerSize), getNumLayers(m_imageType, m_imageSize));

	deviceInterface.cmdCopyImageToBuffer(cmdBuffer, m_intermResultsImage->get(), VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, m_outputBuffer->get(), 1u, &bufferImageCopyParams);
}